

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_taylor.cpp
# Opt level: O3

int taylor_compare<double,4,5>(taylor<double,_4,_5> *t1,taylor<double,_4,_5> *t2,num_t thres)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  double dVar2;
  double dVar3;
  double *pdVar4;
  ostream *poVar5;
  undefined8 extraout_RAX;
  int i;
  ostringstream errmsg;
  ostringstream message;
  string local_400;
  num_t local_3e0;
  char *local_3d8;
  long local_3d0;
  char local_3c8 [16];
  char *local_3b8;
  long local_3b0;
  char local_3a8 [16];
  char *local_398;
  long local_390;
  char local_388 [16];
  char *local_378;
  long local_370;
  char local_368 [16];
  char *local_358;
  long local_350;
  char local_348 [16];
  double local_338;
  undefined8 uStack_330;
  ostringstream local_320 [112];
  ios_base local_2b0 [264];
  ostringstream local_1a8 [112];
  ios_base local_138 [264];
  
  i = 0;
  local_3e0 = thres;
  do {
    pdVar4 = taylor<double,_4,_5>::operator[](t1,i);
    dVar2 = *pdVar4;
    pdVar4 = taylor<double,_4,_5>::operator[](t2,i);
    dVar3 = *pdVar4;
    pdVar4 = taylor<double,_4,_5>::operator[](t1,i);
    local_338 = *pdVar4;
    uStack_330 = 0;
    pdVar4 = taylor<double,_4,_5>::operator[](t2,i);
    if (local_3e0 <
        (ABS(dVar2 - dVar3) + ABS(dVar2 - dVar3)) / (ABS(local_338 + *pdVar4) * 0.5 + 1.0)) {
      std::__cxx11::ostringstream::ostringstream(local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,"Difference in coefficient ",0x1a);
      poVar5 = (ostream *)std::ostream::operator<<((ostream *)local_1a8,i);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,". Correct:",10);
      pdVar4 = taylor<double,_4,_5>::operator[](t1,i);
      poVar5 = std::ostream::_M_insert<double>(*pdVar4);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,", taylor:",9);
      pdVar4 = taylor<double,_4,_5>::operator[](t2,i);
      poVar5 = std::ostream::_M_insert<double>(*pdVar4);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5," difference: ",0xd);
      pdVar4 = taylor<double,_4,_5>::operator[](t1,i);
      dVar2 = *pdVar4;
      pdVar4 = taylor<double,_4,_5>::operator[](t2,i);
      std::ostream::_M_insert<double>(dVar2 - *pdVar4);
      std::__cxx11::ostringstream::ostringstream(local_320);
      paVar1 = &local_400.field_2;
      local_400._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_400,"Taylor fatal error.\n","");
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_320,local_400._M_dataplus._M_p,local_400._M_string_length
                         );
      local_358 = local_348;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_358," In function ","");
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>(poVar5,local_358,local_350);
      local_378 = local_368;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_378,"taylor_compare","");
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>(poVar5,local_378,local_370);
      local_398 = local_388;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_398," at line ","");
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>(poVar5,local_398,local_390);
      poVar5 = (ostream *)std::ostream::operator<<((ostream *)poVar5,0x9d);
      local_3b8 = local_3a8;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_3b8," of file ","");
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>(poVar5,local_3b8,local_3b0);
      local_3d8 = local_3c8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_3d8,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/uekstrom[P]libtaylor/tests/unittest_taylor.cpp"
                 ,"");
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>(poVar5,local_3d8,local_3d0);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
      std::ostream::put((char)poVar5);
      std::ostream::flush();
      if (local_3d8 != local_3c8) {
        operator_delete(local_3d8);
      }
      if (local_3b8 != local_3a8) {
        operator_delete(local_3b8);
      }
      if (local_398 != local_388) {
        operator_delete(local_398);
      }
      if (local_378 != local_368) {
        operator_delete(local_378);
      }
      if (local_358 != local_348) {
        operator_delete(local_358);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_400._M_dataplus._M_p != paVar1) {
        operator_delete(local_400._M_dataplus._M_p);
      }
      std::__cxx11::stringbuf::str();
      message_and_die(&local_400,(ostringstream *)local_1a8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_400._M_dataplus._M_p != paVar1) {
        operator_delete(local_400._M_dataplus._M_p);
      }
      std::__cxx11::ostringstream::~ostringstream(local_320);
      std::ios_base::~ios_base(local_2b0);
      std::__cxx11::ostringstream::~ostringstream(local_1a8);
      std::ios_base::~ios_base(local_138);
      _Unwind_Resume(extraout_RAX);
    }
    i = i + 1;
  } while (i != 0x7e);
  return 0;
}

Assistant:

int taylor_compare(const taylor<T, Nvar, Ndeg> & t1,
                   const taylor<T, Nvar, Ndeg> & t2,
                   num_t thres) {
  int nfail = 0;
  for (int i = 0; i < t1.size; i++) {
    T err = 2 * std::abs(t1[i] - t2[i]) / (1 + 0.5 * std::abs(t1[i] + t2[i]));
    if (err > thres) {
      std::ostringstream message;
      message << "Difference in coefficient " << i << ". Correct:" << t1[i]
              << ", taylor:" << t2[i] << " difference: " << t1[i] - t2[i];
      TAYLOR_ERROR(message);
      nfail++;
    }
  }
  return nfail;
}